

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O3

void __thiscall
Memory::CustomHeap::
CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
DecommitPages(CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
              *this,char *address,size_t pageCount,void *segment)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_00;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_01;
  
  if (segment == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x12e,"(segment)","segment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    bVar2 = IsPreReservedSegment(this,(void *)0x0);
  }
  else {
    bVar2 = SegmentBaseCommon::IsInPreReservedHeapPageAllocator((SegmentBaseCommon *)segment);
  }
  if (bVar2 != false) {
    this_00 = GetPreReservedPageAllocator(this,segment);
    HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::DecommitPages
              (this_00,address,pageCount);
    return;
  }
  this_01 = GetPageAllocator(this,segment);
  HeapPageAllocator<Memory::VirtualAllocWrapper>::DecommitPages(this_01,address,pageCount);
  return;
}

Assistant:

void DecommitPages(__in char* address, size_t pageCount, void* segment)
    {
        // This is merely a wrapper for VirtualFree, no need to synchornize, and doesn't touch any data.
        // No need to assert locked.
        Assert(segment);
        if (IsPreReservedSegment(segment))
        {
            this->GetPreReservedPageAllocator(segment)->DecommitPages(address, pageCount);
        }
        else
        {
            this->GetPageAllocator(segment)->DecommitPages(address, pageCount);
        }
    }